

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O1

void host_end_rewind(Host *host)

{
  Emulator *e;
  Ticks TVar1;
  JoypadButtons buttons;
  JoypadButtons JStack_38;
  
  emulator_get_ticks((host->hook_ctx).e);
  if ((host->rewind_state).rewinding != FALSE) {
    if ((host->rewind_state).rewind_result.info != (RewindInfo *)0x0) {
      e = (host->hook_ctx).e;
      rewind_truncate_to(host->rewind_buffer,e,&(host->rewind_state).rewind_result);
      if ((host->init).joypad_filename == (char *)0x0) {
        joypad_truncate_to(host->joypad_buffer,(host->rewind_state).joypad_playback.current);
        joypad_callback(&JStack_38,host);
      }
      TVar1 = emulator_get_ticks(e);
      host->last_ticks = TVar1;
    }
    (host->rewind_state).joypad_playback.next.chunk = (JoypadChunk *)0x0;
    (host->rewind_state).joypad_playback.next.state = (JoypadState *)0x0;
    (host->rewind_state).joypad_playback.current.chunk = (JoypadChunk *)0x0;
    (host->rewind_state).joypad_playback.current.state = (JoypadState *)0x0;
    (host->rewind_state).joypad_playback.e = (Emulator *)0x0;
    (host->rewind_state).joypad_playback.buffer = (JoypadBuffer *)0x0;
    (host->rewind_state).rewind_result.file_data.data = (u8 *)0x0;
    (host->rewind_state).rewind_result.file_data.size = 0;
    *(undefined8 *)&(host->rewind_state).rewind_result = 0;
    (host->rewind_state).rewind_result.info = (RewindInfo *)0x0;
    *(undefined8 *)&(host->rewind_state).rewinding = 0;
    return;
  }
  __assert_fail("host->rewind_state.rewinding",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/host.c",0x192,
                "void host_end_rewind(Host *)");
}

Assistant:

void host_end_rewind(Host* host) {
  Ticks ticks = emulator_get_ticks(host_get_emulator(host));
  assert(host->rewind_state.rewinding);

  if (host->rewind_state.rewind_result.info) {
    Emulator* e = host_get_emulator(host);
    rewind_truncate_to(host->rewind_buffer, e,
                       &host->rewind_state.rewind_result);
    if (!host->init.joypad_filename) {
      joypad_truncate_to(host->joypad_buffer,
                         host->rewind_state.joypad_playback.current);
      /* Append the current joypad state. */
      JoypadButtons buttons;
      joypad_callback(&buttons, host);
    }
    host->last_ticks = emulator_get_ticks(e);
  }

  memset(&host->rewind_state, 0, sizeof(host->rewind_state));
}